

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cpp
# Opt level: O0

void __thiscall Arena::Arena(Arena *this,Map *map,int time,int block)

{
  TimeEvent *this_00;
  int block_local;
  int time_local;
  Map *map_local;
  Arena *this_local;
  
  std::vector<Arena_Spawn_*,_std::allocator<Arena_Spawn_*>_>::vector(&this->spawns);
  this->map = map;
  this->time = time;
  this->block = block;
  this->occupants = 0;
  this_00 = (TimeEvent *)operator_new(0x30);
  TimeEvent::TimeEvent(this_00,arena_spawn,this,(double)time,-1);
  this->spawn_timer = this_00;
  Timer::Register(&this->map->world->timer,this->spawn_timer);
  return;
}

Assistant:

Arena::Arena(Map *map, int time, int block)
{
	this->map = map;
	this->time = time;
	this->block = block;
	this->occupants = 0;

	this->spawn_timer = new TimeEvent(arena_spawn, this, time, Timer::FOREVER);
	this->map->world->timer.Register(this->spawn_timer);
}